

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O0

void __thiscall unit_test::handle3(unit_test *this)

{
  ostream *poVar1;
  binder *this_00;
  unit_test *in_RDI;
  member_type in_stack_ffffffffffffff88;
  shared_ptr<cppcms::http::context> *this_01;
  binder *func;
  callback<void_(cppcms::http::context::completion_type)> *in_stack_ffffffffffffffd0;
  
  this_01 = &in_RDI->context_;
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x10ccb1);
  cppcms::http::context::response();
  poVar1 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar1,"message1");
  this_00 = (binder *)
            std::
            __shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x10ccda);
  booster::intrusive_ptr<unit_test>::intrusive_ptr
            ((intrusive_ptr<unit_test> *)this_00,in_RDI,SUB81((ulong)this_01 >> 0x38,0));
  func = (binder *)0x0;
  binder::binder(this_00,(intrusive_ptr<unit_test> *)in_RDI,in_stack_ffffffffffffff88);
  booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
            (in_stack_ffffffffffffffd0,func);
  cppcms::http::context::async_flush_output((callback *)this_00);
  booster::callback<void_(cppcms::http::context::completion_type)>::~callback
            ((callback<void_(cppcms::http::context::completion_type)> *)0x10cd54);
  binder::~binder((binder *)0x10cd5e);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr((intrusive_ptr<unit_test> *)this_01);
  return;
}

Assistant:

void handle3()
	{
		context_->response().out()<<"message1";
		context_->async_flush_output(binder(this,&unit_test::handle35));
	}